

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

void square_destroy_decoy(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  trap_kind_conflict *ptVar2;
  loc_conflict lVar3;
  trap_kind *decoy_kind;
  chunk *c_local;
  loc_conflict grid_local;
  
  ptVar2 = lookup_trap("decoy");
  if (ptVar2 == (trap_kind_conflict *)0x0) {
    __assert_fail("decoy_kind",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cave-square.c"
                  ,0x69d,"void square_destroy_decoy(struct chunk *, struct loc)");
  }
  square_remove_all_traps_of_type((chunk_conflict2 *)c,grid,ptVar2->tidx);
  lVar3 = (loc_conflict)loc(0,0);
  c->decoy = lVar3;
  _Var1 = los((chunk_conflict *)c,player->grid,(loc)grid);
  if ((_Var1) && (player->timed[2] == 0)) {
    msg("The decoy is destroyed!");
  }
  return;
}

Assistant:

void square_destroy_decoy(struct chunk *c, struct loc grid)
{
	struct trap_kind *decoy_kind = lookup_trap("decoy");

	assert(decoy_kind);
	square_remove_all_traps_of_type(c, grid, decoy_kind->tidx);
	c->decoy = loc(0, 0);
	if (los(c, player->grid, grid) && !player->timed[TMD_BLIND]){
		msg("The decoy is destroyed!");
	}
}